

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall
ImGuiTextFilter::TextRange::split
          (TextRange *this,char separator,ImVector<ImGuiTextFilter::TextRange> *out)

{
  int *piVar1;
  int iVar2;
  TextRange *pTVar3;
  ImGuiContext *pIVar4;
  TextRange *pTVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  
  pIVar4 = GImGui;
  iVar2 = out->Capacity;
  if (iVar2 < 0) {
    uVar6 = iVar2 / 2 + iVar2;
    uVar8 = 0;
    if (0 < (int)uVar6) {
      uVar8 = (ulong)uVar6;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pTVar5 = (TextRange *)(*(pIVar4->IO).MemAllocFn)(uVar8 << 4);
    if (out->Data != (TextRange *)0x0) {
      memcpy(pTVar5,out->Data,(long)out->Size << 4);
    }
    pTVar3 = out->Data;
    if (pTVar3 != (TextRange *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(pTVar3);
    out->Data = pTVar5;
    out->Capacity = (int)uVar8;
  }
  out->Size = 0;
  pcVar9 = this->b;
  pcVar11 = pcVar9;
  if (pcVar9 < this->e) {
    do {
      pIVar4 = GImGui;
      if (*pcVar9 == separator) {
        iVar2 = out->Capacity;
        if (out->Size == iVar2) {
          if (iVar2 == 0) {
            iVar7 = 8;
          }
          else {
            iVar7 = iVar2 / 2 + iVar2;
          }
          iVar10 = out->Size + 1;
          if (iVar10 < iVar7) {
            iVar10 = iVar7;
          }
          if (iVar2 < iVar10) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + 1;
            pTVar5 = (TextRange *)(*(pIVar4->IO).MemAllocFn)((long)iVar10 << 4);
            if (out->Data != (TextRange *)0x0) {
              memcpy(pTVar5,out->Data,(long)out->Size << 4);
            }
            pTVar3 = out->Data;
            if (pTVar3 != (TextRange *)0x0) {
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + -1;
            }
            (*(GImGui->IO).MemFreeFn)(pTVar3);
            out->Data = pTVar5;
            out->Capacity = iVar10;
          }
        }
        pTVar5 = out->Data;
        iVar2 = out->Size;
        out->Size = iVar2 + 1;
        pTVar5[iVar2].b = pcVar11;
        pTVar5[iVar2].e = pcVar9;
        pcVar11 = pcVar9 + 1;
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 < this->e);
  }
  pIVar4 = GImGui;
  if (pcVar11 != pcVar9) {
    iVar2 = out->Capacity;
    if (out->Size == iVar2) {
      iVar7 = out->Size + 1;
      if (iVar2 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar2 / 2 + iVar2;
      }
      if (iVar7 < iVar10) {
        iVar7 = iVar10;
      }
      if (iVar2 < iVar7) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pTVar5 = (TextRange *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 << 4);
        if (out->Data != (TextRange *)0x0) {
          memcpy(pTVar5,out->Data,(long)out->Size << 4);
        }
        pTVar3 = out->Data;
        if (pTVar3 != (TextRange *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pTVar3);
        out->Data = pTVar5;
        out->Capacity = iVar7;
      }
    }
    pTVar5 = out->Data;
    iVar2 = out->Size;
    out->Size = iVar2 + 1;
    pTVar5[iVar2].b = pcVar11;
    pTVar5[iVar2].e = pcVar9;
  }
  return;
}

Assistant:

void ImGuiTextFilter::TextRange::split(char separator, ImVector<TextRange>& out)
{
    out.resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out.push_back(TextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out.push_back(TextRange(wb, we));
}